

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_compressionParameters cPar,
          unsigned_long_long srcSize,size_t dictSize)

{
  ZSTD_compressionParameters ZVar1;
  uint uVar2;
  U32 UVar3;
  uint uVar4;
  bool bVar5;
  uint local_44;
  U32 cycleLog;
  U32 srcLog;
  U32 tSize;
  size_t dictSize_local;
  unsigned_long_long srcSize_local;
  
  if ((dictSize == 0) || (1 < srcSize + 1)) {
    dictSize_local = srcSize;
    if (srcSize == 0) {
      dictSize_local = 0xffffffffffffffff;
    }
  }
  else {
    dictSize_local = 0x201;
  }
  if ((dictSize_local < 0x40000000) && (dictSize < 0x40000000)) {
    uVar2 = (int)dictSize_local + (int)dictSize;
    if (uVar2 < 0x40) {
      local_44 = 6;
    }
    else {
      UVar3 = ZSTD_highbit32(uVar2 - 1);
      local_44 = UVar3 + 1;
    }
    if (local_44 < cPar.windowLog) {
      cPar.windowLog = local_44;
    }
  }
  ZVar1 = cPar;
  uVar2 = cPar.windowLog;
  if (cPar.windowLog + 1 < cPar.hashLog) {
    uVar4 = cPar.windowLog + 1;
    cPar.hashLog = uVar4;
  }
  UVar3 = ZSTD_cycleLog(cPar.chainLog,cPar.strategy);
  cPar = ZVar1;
  if (uVar2 < UVar3) {
    cPar._8_20_ = ZVar1._8_20_;
    cPar.chainLog = 0;
    cPar._0_8_ = CONCAT44(cPar.chainLog,uVar2);
  }
  bVar5 = cPar.windowLog < 10;
  cPar = ZVar1;
  if (bVar5) {
    cPar.windowLog = 10;
  }
  ZVar1 = cPar;
  __return_storage_ptr__->windowLog = cPar.windowLog;
  __return_storage_ptr__->chainLog = cPar.chainLog;
  cPar._8_8_ = ZVar1._8_8_;
  __return_storage_ptr__->hashLog = cPar.hashLog;
  __return_storage_ptr__->searchLog = cPar.searchLog;
  cPar._16_8_ = ZVar1._16_8_;
  __return_storage_ptr__->minMatch = cPar.minMatch;
  __return_storage_ptr__->targetLength = cPar.targetLength;
  cPar.strategy = ZVar1.strategy;
  __return_storage_ptr__->strategy = cPar.strategy;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar,
                            unsigned long long srcSize,
                            size_t dictSize)
{
    static const U64 minSrcSize = 513; /* (1<<9) + 1 */
    static const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    if (dictSize && (srcSize+1<2) /* srcSize unknown */ )
        srcSize = minSrcSize;  /* presumed small when there is a dictionary */
    else if (srcSize == 0)
        srcSize = ZSTD_CONTENTSIZE_UNKNOWN;  /* 0 == unknown : presumed large */

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize < maxWindowResize)
      && (dictSize < maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (cPar.hashLog > cPar.windowLog+1) cPar.hashLog = cPar.windowLog+1;
    {   U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cycleLog > cPar.windowLog)
            cPar.chainLog -= (cycleLog - cPar.windowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* required for frame header */

    return cPar;
}